

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_short> *this_00;
  uint32 *puVar1;
  uint16 *puVar2;
  bool bVar3;
  int iVar4;
  void *pContext;
  undefined7 extraout_var;
  decoder_tables *pdVar5;
  undefined7 extraout_var_00;
  undefined7 uVar6;
  uint uVar7;
  uint16 *in_RCX;
  uint in_EDX;
  uint in_R8D;
  uint uVar8;
  uint max_code_size;
  uint total_freq;
  uint local_30;
  uint local_2c;
  
  this->m_encoding = SUB81(ctx,0);
  uVar8 = 0x10;
  if (in_R8D < 0x10) {
    uVar8 = in_R8D;
  }
  this->m_total_syms = in_EDX;
  uVar7 = (this->m_code_sizes).m_size;
  if (uVar7 != in_EDX) {
    if (uVar7 <= in_EDX) {
      if ((this->m_code_sizes).m_capacity < in_EDX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_code_sizes,in_EDX,uVar7 + 1 == in_EDX,1,
                   (object_mover)0x0,false);
      }
      uVar7 = (this->m_code_sizes).m_size;
      memset((this->m_code_sizes).m_p + uVar7,0,(ulong)(in_EDX - uVar7));
    }
    (this->m_code_sizes).m_size = in_EDX;
  }
  pContext = create_generate_huffman_codes_tables();
  local_30 = 0;
  bVar3 = generate_huffman_codes
                    (pContext,this->m_total_syms,in_RCX,(this->m_code_sizes).m_p,&local_30,&local_2c
                    );
  free_generate_huffman_codes_tables(pContext);
  if ((bVar3) &&
     ((local_30 <= uVar8 ||
      (bVar3 = prefix_coding::limit_max_code_size(this->m_total_syms,(this->m_code_sizes).m_p,uVar8)
      , bVar3)))) {
    this_00 = &this->m_codes;
    if (this->m_encoding == true) {
      uVar8 = (this->m_codes).m_size;
      if (uVar8 != in_EDX) {
        if (uVar8 <= in_EDX) {
          if ((this->m_codes).m_capacity < in_EDX) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,in_EDX,uVar8 + 1 == in_EDX,2,(object_mover)0x0,
                       false);
          }
          uVar8 = (this->m_codes).m_size;
          memset((this->m_codes).m_p + uVar8,0,(ulong)(in_EDX - uVar8) * 2);
        }
        (this->m_codes).m_size = in_EDX;
      }
      pdVar5 = this->m_pDecode_tables;
      if (pdVar5 != (decoder_tables *)0x0) {
        puVar1 = pdVar5->m_lookup;
        if ((puVar1 != (uint32 *)0x0) && ((puVar1[-2] ^ puVar1[-1]) == 0xffffffff)) {
          crnlib_free(puVar1 + -4);
        }
        puVar2 = pdVar5->m_sorted_symbol_order;
        if ((puVar2 != (uint16 *)0x0) &&
           ((*(uint *)(puVar2 + -4) ^ *(uint *)(puVar2 + -2)) == 0xffffffff)) {
          crnlib_free(puVar2 + -8);
        }
        crnlib_free(pdVar5);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      bVar3 = prefix_coding::generate_codes
                        (this->m_total_syms,(this->m_code_sizes).m_p,(this->m_codes).m_p);
      uVar6 = extraout_var;
    }
    else {
      if (this_00->m_p != (unsigned_short *)0x0) {
        crnlib_free(this_00->m_p);
        this_00->m_p = (unsigned_short *)0x0;
        (this->m_codes).m_size = 0;
        (this->m_codes).m_capacity = 0;
      }
      if (this->m_pDecode_tables == (decoder_tables *)0x0) {
        pdVar5 = (decoder_tables *)crnlib_malloc(0xc0);
        pdVar5->m_table_shift = 0;
        pdVar5->m_table_max_code = 0;
        pdVar5->m_decode_start_code_size = 0;
        pdVar5->m_sorted_symbol_order = (uint16 *)0x0;
        *(undefined8 *)&pdVar5->m_cur_lookup_size = 0;
        *(undefined8 *)((long)&pdVar5->m_lookup + 4) = 0;
        this->m_pDecode_tables = pdVar5;
      }
      uVar8 = this->m_total_syms;
      uVar7 = 0;
      if (0x10 < uVar8) {
        iVar4 = 0;
        uVar7 = uVar8;
        do {
          iVar4 = iVar4 + -1;
          bVar3 = 3 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar3);
        uVar7 = (((uint)(2 << (~(byte)iVar4 & 0x1f)) < uVar8) + 1) - iVar4;
        if (10 < uVar7) {
          uVar7 = 0xb;
        }
        if (iVar4 == -0x20) {
          uVar7 = 0xb;
        }
      }
      bVar3 = prefix_coding::generate_decoder_tables
                        (uVar8,(this->m_code_sizes).m_p,this->m_pDecode_tables,uVar7);
      uVar6 = extraout_var_00;
    }
    if (bVar3 != false) {
      return (int)CONCAT71(uVar6,1);
    }
  }
  return 0;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint16* pSym_freq, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        m_encoding = encoding;

        m_total_syms = total_syms;

        code_size_limit = math::minimum(code_size_limit, prefix_coding::cMaxExpectedCodeSize);

        m_code_sizes.resize(total_syms);

        void* pTables = create_generate_huffman_codes_tables();

        uint max_code_size = 0, total_freq;
        bool status = generate_huffman_codes(pTables, m_total_syms, pSym_freq, &m_code_sizes[0], max_code_size, total_freq);

        free_generate_huffman_codes_tables(pTables);

        if (!status)
        {
            return false;
        }

        if (max_code_size > code_size_limit)
        {
            if (!prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], code_size_limit))
            {
                return false;
            }
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);

            if (m_pDecode_tables)
            {
                crnlib_delete(m_pDecode_tables);
                m_pDecode_tables = nullptr;
            }

            if (!prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]))
            {
                return false;
            }
        }
        else
        {
            m_codes.clear();

            if (!m_pDecode_tables)
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
            }

            if (!prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits()))
            {
                return false;
            }
        }

        return true;
    }